

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O2

err_t bpkiPrivkeyWrap(octet *epki,size_t *epki_len,octet *privkey,size_t privkey_len,octet *pwd,
                     size_t pwd_len,octet *salt,size_t iter)

{
  ulong uVar1;
  bool_t bVar2;
  err_t eVar3;
  size_t sVar4;
  octet *key;
  size_t count;
  size_t local_48;
  
  if (9999 < iter) {
    uVar1 = privkey_len - 0x18 >> 3;
    if (5 < (privkey_len << 0x3d | uVar1)) {
      return 0x1f8;
    }
    if ((0x2bUL >> (uVar1 & 0x3f) & 1) == 0) {
      return 0x1f8;
    }
    sVar4 = bpkiPrivkeyEnc((octet *)0x0,privkey,privkey_len);
    if (sVar4 == 0xffffffffffffffff) {
      return 0x132;
    }
    local_48 = bpkiEdataEnc((octet *)0x0,(octet *)0x0,sVar4 + 0x10,(octet *)0x0,iter);
    if (local_48 == 0xffffffffffffffff) {
      return 0x132;
    }
    if (epki_len != (size_t *)0x0) {
      bVar2 = memIsValid(epki_len,8);
      if (bVar2 == 0) {
        return 0x6d;
      }
      *epki_len = local_48;
    }
    if (epki == (octet *)0x0) {
      return 0;
    }
    bVar2 = memIsValid(privkey,privkey_len);
    if (((bVar2 != 0) && (bVar2 = memIsValid(epki,local_48), bVar2 != 0)) &&
       (bVar2 = memIsValid(pwd,pwd_len), bVar2 != 0)) {
      bVar2 = memIsValid(salt,8);
      if (bVar2 == 0) {
        return 0x6d;
      }
      key = (octet *)blobCreate(0x20);
      if (key == (octet *)0x0) {
        return 0x6e;
      }
      eVar3 = beltPBKDF2(key,pwd,pwd_len,iter,salt,8);
      if (eVar3 == 0) {
        count = bpkiPrivkeyEnc(epki + (local_48 - sVar4),privkey,privkey_len);
        if (count == 0xffffffffffffffff) {
          eVar3 = 0x1f8;
        }
        else {
          eVar3 = beltKWPWrap(epki + (local_48 - count) + -0x10,epki + (local_48 - count),count,
                              (octet *)0x0,key,0x20);
          if (eVar3 == 0) {
            sVar4 = bpkiEdataEnc(epki,epki + (local_48 - sVar4) + -0x10,sVar4 + 0x10,salt,iter);
            eVar3 = 0;
            if (sVar4 != 0xffffffffffffffff) goto LAB_00136976;
            eVar3 = 0x132;
            local_48 = 0xffffffffffffffff;
          }
        }
        memWipe(epki,local_48);
      }
LAB_00136976:
      blobClose(key);
      return eVar3;
    }
  }
  return 0x6d;
}

Assistant:

err_t bpkiPrivkeyWrap(octet epki[], size_t* epki_len, const octet privkey[],
	size_t privkey_len, const octet pwd[], size_t pwd_len,
	const octet salt[8], size_t iter)
{
	size_t pki_len, edata_len, count;
	octet* key;
	err_t code;
	// проверить входные данные
	if (iter < 10000)
		return ERR_BAD_INPUT;
	if (privkey_len != 32 && privkey_len != 24 && privkey_len != 48 && 
		privkey_len != 64)
		return ERR_BAD_PRIVKEY;
	// определить длину epki
	pki_len = bpkiPrivkeyEnc(0, privkey, privkey_len);
	if (pki_len == SIZE_MAX)
		return ERR_BAD_FORMAT;
	edata_len = pki_len + 16;
	count = bpkiEdataEnc(0, 0, edata_len, 0, iter);
	if (count == SIZE_MAX)
		return ERR_BAD_FORMAT;
	if (epki_len)
	{
		if (!memIsValid(epki_len, O_PER_S))
			return ERR_BAD_INPUT;
		*epki_len = count;
	}
	if (!epki)
		return ERR_OK;
	// проверить указатели
	if (!memIsValid(privkey, privkey_len) ||
		!memIsValid(epki, count) ||
			!memIsValid(pwd, pwd_len) ||
		!memIsValid(salt, 8))
		return ERR_BAD_INPUT;
	// сгенерировать ключ
	key = (octet*)blobCreate(32);
	if (!key)
		return ERR_OUTOFMEMORY;
	code = beltPBKDF2(key, pwd, pwd_len, iter, salt, 8);
	ERR_CALL_HANDLE(code, blobClose(key));
	// кодировать pki
	pki_len = bpkiPrivkeyEnc(epki + count - pki_len, privkey, privkey_len);
	code = pki_len != SIZE_MAX ? ERR_OK : ERR_BAD_PRIVKEY;
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// зашифровать pki
	code = beltKWPWrap(epki + count - pki_len - 16,
		epki + count - pki_len,	pki_len, 0, key, 32);
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// кодировать edata и epki
	count = bpkiEdataEnc(epki, epki + count - edata_len, edata_len,
		salt, iter);
	code = count != SIZE_MAX ? ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, (memWipe(epki, count), blobClose(key)));
	// все нормально
	blobClose(key);
	return ERR_OK;
}